

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O0

Vec_Int_t * Acec_FindXorRoots(Gia_Man_t *p,Vec_Int_t *vXors)

{
  int iVar1;
  Vec_Bit_t *p_00;
  Vec_Int_t *p_01;
  undefined4 local_2c;
  int i;
  Vec_Int_t *vXorRoots;
  Vec_Bit_t *vMapXorIns;
  Vec_Int_t *vXors_local;
  Gia_Man_t *p_local;
  
  p_00 = Acec_MapXorIns(p,vXors);
  p_01 = Vec_IntAlloc(100);
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vXors);
    if (iVar1 <= local_2c << 2) break;
    iVar1 = Vec_IntEntry(vXors,local_2c << 2);
    iVar1 = Vec_BitEntry(p_00,iVar1);
    if (iVar1 == 0) {
      iVar1 = Vec_IntEntry(vXors,local_2c << 2);
      Vec_IntPushUniqueOrder(p_01,iVar1);
    }
    local_2c = local_2c + 1;
  }
  Vec_BitFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Acec_FindXorRoots( Gia_Man_t * p, Vec_Int_t * vXors )
{
    Vec_Bit_t * vMapXorIns = Acec_MapXorIns( p, vXors );
    Vec_Int_t * vXorRoots = Vec_IntAlloc( 100 );  int i;
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        if ( !Vec_BitEntry(vMapXorIns, Vec_IntEntry(vXors, 4*i)) )
            Vec_IntPushUniqueOrder( vXorRoots, Vec_IntEntry(vXors, 4*i) );
    Vec_BitFree( vMapXorIns );
    return vXorRoots;
}